

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_suite.cpp
# Opt level: O2

void __thiscall
sqlcheck::TestSuite_MetadataTribblesTest_Test::~TestSuite_MetadataTribblesTest_Test
          (TestSuite_MetadataTribblesTest_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(TestSuite, MetadataTribblesTest) {

  Configuration default_conf;
  default_conf.testing_mode = true;
  default_conf.verbose = false;

  std::unique_ptr<std::istringstream> stream(new std::istringstream());
  stream->str(

      "CREATE TABLE ProjectHistory (\n" // 1
      "bugs_fixed_2008  INT,\n"         // 2
      "bugs_fixed_2009  INT,\n"         // 3
      "bugs_fixed_2010  INT,\n"         // 4
      "2010  INT"                       // 5
      ");\n"                            // 5

      "CREATE TABLE Bugs_2008 ( . . . );\n" // 6

      "ALTER TABLE Customers ADD (revenue2002 NUMBER(9,2));\n" // 7

      "CREATE TABLE Bugs_2009 (-- other columns" // 8
      "date_reported DATE CHECK (EXTRACT(YEAR FROM date_reported) = 2009));\n" // 8

  );

  default_conf.test_stream.reset(stream.release());

  Check(default_conf);

}